

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress_order.cpp
# Opt level: O2

void __thiscall
duckdb::CompressedMaterialization::UpdateOrderStats
          (CompressedMaterialization *this,
          unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
          *op)

{
  _Head_base<0UL,_duckdb::BaseStatistics_*,_false> __p;
  __uniq_ptr_data<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true,_true>
  in_RAX;
  pointer pLVar1;
  reference this_00;
  LogicalOrder *pLVar2;
  reference pvVar3;
  type this_01;
  BoundColumnRefExpression *pBVar4;
  iterator iVar5;
  idx_t order_node_idx;
  ulong __n;
  _Head_base<0UL,_duckdb::BaseStatistics_*,_false> local_38;
  
  local_38._M_head_impl =
       (BaseStatistics *)
       in_RAX.
       super___uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>.
       _M_t.
       super__Tuple_impl<0UL,_duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics>_>
       .super__Head_base<0UL,_duckdb::BaseStatistics_*,_false>._M_head_impl;
  pLVar1 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
           operator->(op);
  if (pLVar1->type == LOGICAL_PROJECTION) {
    pLVar1 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
             ::operator->(op);
    this_00 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
              ::get<true>(&pLVar1->children,0);
    pLVar1 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
             ::operator->(this_00);
    pLVar2 = LogicalOperator::Cast<duckdb::LogicalOrder>(pLVar1);
    for (__n = 0; __n < (ulong)(((long)(pLVar2->orders).
                                       super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
                                       .
                                       super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(pLVar2->orders).
                                      super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
                                      .
                                      super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
                                      ._M_impl.super__Vector_impl_data._M_start) / 0x18);
        __n = __n + 1) {
      pvVar3 = vector<duckdb::BoundOrderByNode,_true>::get<true>(&pLVar2->orders,__n);
      this_01 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                operator*(&pvVar3->expression);
      if ((this_01->super_BaseExpression).type == BOUND_COLUMN_REF) {
        pBVar4 = BaseExpression::Cast<duckdb::BoundColumnRefExpression>
                           (&this_01->super_BaseExpression);
        iVar5 = ::std::
                _Hashtable<duckdb::ColumnBinding,_std::pair<const_duckdb::ColumnBinding,_duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>_>,_std::allocator<std::pair<const_duckdb::ColumnBinding,_duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>_>_>,_std::__detail::_Select1st,_duckdb::ColumnBindingEquality,_duckdb::ColumnBindingHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                ::find(&this->statistics_map->_M_h,&pBVar4->binding);
        if ((iVar5.
             super__Node_iterator_base<std::pair<const_duckdb::ColumnBinding,_duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>_>,_true>
             ._M_cur != (__node_type *)0x0) &&
           (*(long *)((long)iVar5.
                            super__Node_iterator_base<std::pair<const_duckdb::ColumnBinding,_duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>_>,_true>
                            ._M_cur + 0x18) != 0)) {
          unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>::
          operator->((unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                      *)((long)iVar5.
                               super__Node_iterator_base<std::pair<const_duckdb::ColumnBinding,_duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>_>,_true>
                               ._M_cur + 0x18));
          BaseStatistics::ToUnique((BaseStatistics *)&stack0xffffffffffffffc8);
          __p._M_head_impl = local_38._M_head_impl;
          local_38._M_head_impl = (pointer)0x0;
          ::std::
          __uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>::
          reset((__uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>
                 *)&pvVar3->stats,__p._M_head_impl);
          ::std::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>::
          ~unique_ptr((unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>
                       *)&stack0xffffffffffffffc8);
        }
      }
    }
  }
  return;
}

Assistant:

void CompressedMaterialization::UpdateOrderStats(unique_ptr<LogicalOperator> &op) {
	if (op->type != LogicalOperatorType::LOGICAL_PROJECTION) {
		return;
	}

	// Update order stats if compressed
	auto &compressed_order = op->children[0]->Cast<LogicalOrder>();
	for (idx_t order_node_idx = 0; order_node_idx < compressed_order.orders.size(); order_node_idx++) {
		auto &bound_order = compressed_order.orders[order_node_idx];
		auto &order_expression = *bound_order.expression;
		if (order_expression.GetExpressionType() != ExpressionType::BOUND_COLUMN_REF) {
			continue;
		}
		auto &colref = order_expression.Cast<BoundColumnRefExpression>();
		auto it = statistics_map.find(colref.binding);
		if (it != statistics_map.end() && it->second) {
			bound_order.stats = it->second->ToUnique();
		}
	}
}